

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O3

void __thiscall embree::ISPCQuadMesh::~ISPCQuadMesh(ISPCQuadMesh *this)

{
  Vec3fa **ppVVar1;
  ulong uVar2;
  
  ppVVar1 = this->positions;
  if (ppVVar1 != (Vec3fa **)0x0) {
    if (this->numTimeSteps != 0) {
      uVar2 = 0;
      do {
        alignedUSMFree(this->positions[uVar2]);
        uVar2 = uVar2 + 1;
      } while (uVar2 < this->numTimeSteps);
      ppVVar1 = this->positions;
    }
    alignedUSMFree(ppVVar1);
  }
  ppVVar1 = this->normals;
  if (ppVVar1 != (Vec3fa **)0x0) {
    if (this->numTimeSteps != 0) {
      uVar2 = 0;
      do {
        alignedUSMFree(this->normals[uVar2]);
        uVar2 = uVar2 + 1;
      } while (uVar2 < this->numTimeSteps);
      ppVVar1 = this->normals;
    }
    alignedUSMFree(ppVVar1);
  }
  alignedUSMFree(this->texcoords);
  alignedUSMFree(this->quads);
  ISPCGeometry::~ISPCGeometry(&this->geom);
  return;
}

Assistant:

ISPCQuadMesh::~ISPCQuadMesh ()
  {
    if (positions) {
      for (size_t i=0; i<numTimeSteps; i++) alignedUSMFree(positions[i]);
      alignedUSMFree(positions);
    }
    
    if (normals) {
      for (size_t i=0; i<numTimeSteps; i++) alignedUSMFree(normals[i]);
      alignedUSMFree(normals);
    }

    alignedUSMFree(texcoords);
    alignedUSMFree(quads);
  }